

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

long __thiscall CTcPrsOpDiv::calc_result(CTcPrsOpDiv *this,long a,long b,int *ov)

{
  if (b != 0) {
    *ov = (uint)(b == 1 && a == -0x80000000);
    return a / b;
  }
  CTcTokenizer::log_error(0x2af9);
  return 1;
}

Assistant:

long CTcPrsOpDiv::calc_result(long a, long b, int &ov) const
{
    /* check for divide-by-zero */
    if (b == 0)
    {
        /* log a divide-by-zero error */
        G_tok->log_error(TCERR_CONST_DIV_ZERO);

        /* the result isn't really meaningful, but return something anyway */
        return 1;
    }

    /* 
     *   check for overflow - there's only one way that integer division can
     *   overflow, which is to divide INT32MINVAL by -1 
     */
    ov = (a == INT32MINVAL && b == 1);

    /* return the result */
    return a / b;
}